

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::squash_deleted(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                 *this)

{
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  tmp;
  
  if (this->num_deleted != 0) {
    dense_hashtable(&tmp,this,0x20);
    swap(this,&tmp);
    free(tmp.table);
    if (this->num_deleted != 0) {
      __assert_fail("num_deleted == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                    ,0x17a,
                    "void google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::squash_deleted() [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                   );
    }
  }
  return;
}

Assistant:

void squash_deleted() {           // gets rid of any deleted entries we have
    if ( num_deleted ) {            // get rid of deleted before writing
      dense_hashtable tmp(*this);   // copying will get rid of deleted
      swap(tmp);                    // now we are tmp
    }
    assert(num_deleted == 0);
  }